

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dino_http.c
# Opt level: O0

dino_route_t *
list_method_find(dino_route_t *list,dino_http_method method,stack_char_ptr_t *url_stack)

{
  bool bVar1;
  int iVar2;
  bool bVar3;
  int local_28;
  int index;
  _Bool match;
  stack_char_ptr_t *url_stack_local;
  dino_route_struct *pdStack_10;
  dino_http_method method_local;
  dino_route_t *list_local;
  
  bVar1 = false;
  pdStack_10 = list;
  do {
    if (pdStack_10 == (dino_route_t *)0x0) {
      return (dino_route_t *)0x0;
    }
    local_28 = 0;
    if ((method == pdStack_10->method) && (pdStack_10->stack->count == url_stack->count)) {
      bVar1 = true;
      while( true ) {
        bVar3 = false;
        if ((ulong)(long)local_28 < pdStack_10->stack->count) {
          bVar3 = (ulong)(long)local_28 < url_stack->count;
        }
        if (!bVar3) goto LAB_00105024;
        if (((*pdStack_10->stack->pointers[local_28] != '*') &&
            (*pdStack_10->stack->pointers[local_28] != ':')) &&
           (iVar2 = strcmp(pdStack_10->stack->pointers[local_28],url_stack->pointers[local_28]),
           iVar2 != 0)) break;
        local_28 = local_28 + 1;
      }
      bVar1 = false;
    }
LAB_00105024:
    if (bVar1) {
      return pdStack_10;
    }
    pdStack_10 = pdStack_10->next;
  } while( true );
}

Assistant:

dino_route_t *list_method_find(dino_route_t *list, dino_http_method method, stack_char_ptr_t *url_stack) {
    bool match = false;

    while (NULL != list) {
        int index = 0;

        if (method == list->method) {
            // Do they have the same number of elements?
            //
            if (list->stack->count == url_stack->count) {
                // Assume that we have a match...
                //
                match = true;

                // Now compare the elements.
                //
                for (; index < list->stack->count && index < url_stack->count; index++) {
                    // If it is a wild card then assume it is good!
                    //
                    if (list->stack->pointers[index][0] == '*') {
                        continue;
                    }

                    // Do we have a :param element?
                    //
                    if (list->stack->pointers[index][0] == ':') {
                        continue;
                    }

                    // Ok see if they are the same string
                    //
                    if (0 != strcmp(list->stack->pointers[index], url_stack->pointers[index])) {
                        match = false;
                        break;
                    }
                }
            }
        }

        if (match) {
            break;
        }

        list = list->next;
    }

    return list;
}